

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_topology.cpp
# Opt level: O2

LOs __thiscall
Omega_h::get_verts_onto(Omega_h *this,Mesh *mesh,LOs *rails2edges,Read<signed_char> *rail_col_dirs)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  ulong uVar2;
  uint size_in;
  size_t sVar3;
  LOs LVar4;
  Write<int> keys2verts_onto_w;
  Write<int> local_110;
  LOs ev2v;
  string local_f0;
  Write<int> local_d0;
  Write<int> local_c0;
  Write<int> local_b0;
  Write<signed_char> local_a0;
  Write<int> local_90;
  Write<int> local_80;
  type set_key_onto;
  
  pAVar1 = (rails2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  Mesh::ask_verts_of((Mesh *)&ev2v,(Int)mesh);
  std::__cxx11::string::string((string *)&local_f0,"",(allocator *)&local_b0);
  size_in = (uint)(sVar3 >> 2);
  Write<int>::Write(&keys2verts_onto_w,size_in,-1,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  Write<int>::Write((Write<int> *)&set_key_onto,&rails2edges->write_);
  Write<signed_char>::Write(&set_key_onto.rail_col_dirs.write_,&rail_col_dirs->write_);
  Write<int>::Write(&set_key_onto.keys2verts_onto_w,&keys2verts_onto_w);
  Write<int>::Write(&set_key_onto.ev2v.write_,&ev2v.write_);
  Write<int>::Write(&local_b0,(Write<int> *)&set_key_onto);
  Write<signed_char>::Write(&local_a0,&set_key_onto.rail_col_dirs.write_);
  Write<int>::Write(&local_90,&set_key_onto.keys2verts_onto_w);
  Write<int>::Write(&local_80,&set_key_onto.ev2v.write_);
  if (0 < (int)size_in) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&local_f0,&local_b0);
    Write<signed_char>::Write((Write<signed_char> *)&local_f0.field_2,&local_a0);
    Write<int>::Write(&local_d0,&local_90);
    Write<int>::Write(&local_c0,&local_80);
    entering_parallel = 0;
    for (uVar2 = 0; (size_in & 0x7fffffff) != uVar2; uVar2 = uVar2 + 1) {
      *(undefined4 *)
       ((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
               local_d0.shared_alloc_.direct_ptr)->_M_ptr + uVar2 * 4) =
           *(undefined4 *)
            ((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                    local_c0.shared_alloc_.direct_ptr)->_M_ptr +
            (long)((*(int *)(local_f0._M_string_length + uVar2 * 4) * 2 + 1) -
                  (int)*(char *)(local_f0.field_2._8_8_ + uVar2)) * 4);
    }
    get_verts_onto(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
              ((__0 *)&local_f0);
  }
  get_verts_onto(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&local_b0);
  Write<int>::Write(&local_110,&keys2verts_onto_w);
  Read<int>::Read((Read<signed_char> *)this,&local_110);
  Write<int>::~Write(&local_110);
  get_verts_onto(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&set_key_onto);
  Write<int>::~Write(&keys2verts_onto_w);
  Write<int>::~Write(&ev2v.write_);
  LVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar4.write_.shared_alloc_;
}

Assistant:

LOs get_verts_onto(Mesh* mesh, LOs rails2edges, Read<I8> rail_col_dirs) {
  auto nkeys = rails2edges.size();
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto keys2verts_onto_w = Write<LO>(nkeys, -1);
  auto set_key_onto = OMEGA_H_LAMBDA(LO key) {
    auto e = rails2edges[key];
    auto eev = rail_col_dirs[key];
    keys2verts_onto_w[key] = ev2v[e * 2 + (1 - eev)];
  };
  parallel_for(nkeys, set_key_onto, "get_verts_onto");
  return keys2verts_onto_w;
}